

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonPatchFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  JsonParse *pJVar2;
  int rc;
  JsonParse *pPatch;
  JsonParse *pTarget;
  u32 in_stack_0000005c;
  JsonParse *in_stack_00000060;
  u32 in_stack_0000006c;
  JsonParse *in_stack_00000070;
  JsonParse *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  
  pJVar2 = jsonParseFuncArg((sqlite3_context *)pTarget,(sqlite3_value *)pPatch,rc);
  if (pJVar2 != (JsonParse *)0x0) {
    pJVar2 = jsonParseFuncArg((sqlite3_context *)pTarget,(sqlite3_value *)pPatch,rc);
    if (pJVar2 != (JsonParse *)0x0) {
      iVar1 = jsonMergePatch(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_0000005c
                            );
      if (iVar1 == 0) {
        jsonReturnParse((sqlite3_context *)(ulong)in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffc8);
      }
      else if (iVar1 == 3) {
        sqlite3_result_error_nomem((sqlite3_context *)0x2304c7);
      }
      else {
        sqlite3_result_error
                  ((sqlite3_context *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                   (char *)in_stack_ffffffffffffffc8,0);
      }
      jsonParseFree((JsonParse *)0x2304eb);
    }
    jsonParseFree((JsonParse *)0x2304f5);
  }
  return;
}

Assistant:

static void jsonPatchFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *pTarget;    /* The TARGET */
  JsonParse *pPatch;     /* The PATCH */
  int rc;                /* Result code */

  UNUSED_PARAMETER(argc);
  assert( argc==2 );
  pTarget = jsonParseFuncArg(ctx, argv[0], JSON_EDITABLE);
  if( pTarget==0 ) return;
  pPatch = jsonParseFuncArg(ctx, argv[1], 0);
  if( pPatch ){
    rc = jsonMergePatch(pTarget, 0, pPatch, 0);
    if( rc==JSON_MERGE_OK ){
      jsonReturnParse(ctx, pTarget);
    }else if( rc==JSON_MERGE_OOM ){
      sqlite3_result_error_nomem(ctx);
    }else{
      sqlite3_result_error(ctx, "malformed JSON", -1);
    }
    jsonParseFree(pPatch);
  }
  jsonParseFree(pTarget);
}